

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O2

void gen_vspltisw_vinsertw(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGv_i32 ret;
  TCGv_ptr pTVar1;
  TCGv_ptr pTVar2;
  uint uVar3;
  uintptr_t o_1;
  uintptr_t o_2;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  uVar3 = ctx->opcode;
  if ((uVar3 & 1) == 0) {
    if ((ctx->insns_flags & 0x1000000) == 0) {
LAB_00a0f20b:
      gen_inval_exception(ctx,1);
      return;
    }
    if (ctx->altivec_enabled != false) {
      tcg_gen_gvec_dup32i_ppc64
                (ctx->uc->tcg_ctx,(uVar3 >> 0x11 & 0x1f0) + 0x12d20,0x10,0x10,
                 (int)(uVar3 << 0xb) >> 0x1b);
      return;
    }
  }
  else {
    if ((ctx->insns_flags2 & 0x80000) == 0) goto LAB_00a0f20b;
    if (ctx->altivec_enabled != false) {
      uVar3 = uVar3 >> 0x10 & 0xf;
      tcg_ctx = ctx->uc->tcg_ctx;
      ret = tcg_temp_new_i32(tcg_ctx);
      if (0xc < uVar3) {
        uVar3 = 0;
      }
      tcg_gen_movi_i32(tcg_ctx,ret,uVar3);
      pTVar1 = gen_avr_ptr(tcg_ctx,ctx->opcode >> 0xb & 0x1f);
      pTVar2 = gen_avr_ptr(tcg_ctx,ctx->opcode >> 0x15 & 0x1f);
      local_48 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
      local_40 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
      local_38 = (TCGTemp *)(ret + (long)tcg_ctx);
      tcg_gen_callN_ppc64(tcg_ctx,helper_vinsertw_ppc64,(TCGTemp *)0x0,3,&local_48);
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
      return;
    }
  }
  gen_exception(ctx,0x49);
  return;
}

Assistant:

static void gen_vsldoi(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_ptr ra, rb, rd;
    TCGv_i32 sh;
    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }
    ra = gen_avr_ptr(tcg_ctx, rA(ctx->opcode));
    rb = gen_avr_ptr(tcg_ctx, rB(ctx->opcode));
    rd = gen_avr_ptr(tcg_ctx, rD(ctx->opcode));
    sh = tcg_const_i32(tcg_ctx, VSH(ctx->opcode));
    gen_helper_vsldoi(tcg_ctx, rd, ra, rb, sh);
    tcg_temp_free_ptr(tcg_ctx, ra);
    tcg_temp_free_ptr(tcg_ctx, rb);
    tcg_temp_free_ptr(tcg_ctx, rd);
    tcg_temp_free_i32(tcg_ctx, sh);
}